

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# munkres.hxx
# Opt level: O0

Index __thiscall
markurem::matching::
Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
::find_prime_in_row(Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
                    *this,Index row)

{
  bool bVar1;
  pointer pAVar2;
  Value VVar3;
  reference pvVar4;
  runtime_error *this_00;
  long in_RDI;
  AdjacencyIterator it;
  Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_> *in_stack_ffffffffffffffb8;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffc0;
  __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
  local_18 [3];
  
  local_18[0]._M_current =
       (Adjacency<unsigned_long> *)
       andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::
       adjacenciesFromVertexBegin(in_stack_ffffffffffffffb8,0x1d1605);
  while( true ) {
    andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::
    adjacenciesFromVertexEnd(in_stack_ffffffffffffffb8,0x1d161c);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                        *)in_stack_ffffffffffffffc0,
                       (__normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                        *)in_stack_ffffffffffffffb8);
    if (!bVar1) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Could not find prime in given row!");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    in_stack_ffffffffffffffc0 = *(vector<int,_std::allocator<int>_> **)(in_RDI + 0x10);
    pAVar2 = __gnu_cxx::
             __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
             ::operator->(local_18);
    VVar3 = andres::graph::Adjacency<unsigned_long>::edge(pAVar2);
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](in_stack_ffffffffffffffc0,VVar3);
    if (*pvVar4 == 2) break;
    __gnu_cxx::
    __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
    ::operator++(local_18);
  }
  pAVar2 = __gnu_cxx::
           __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
           ::operator->(local_18);
  VVar3 = andres::graph::Adjacency<unsigned_long>::vertex(pAVar2);
  return VVar3;
}

Assistant:

typename Matching<GRAPH, COST, MASK>::Index
Matching<GRAPH, COST, MASK>::find_prime_in_row(Index const row) const
{

    for (auto it = graph_.adjacenciesFromVertexBegin(row);
         it != graph_.adjacenciesFromVertexEnd(row); ++it)
        if (mask_[it->edge()] == PRIMED)
            return it->vertex();

    throw std::runtime_error("Could not find prime in given row!");
}